

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::d_formatter<spdlog::details::null_scoped_padder>::format
          (d_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  byte bVar2;
  size_t sVar3;
  buffer<char> *buf;
  ulong uVar4;
  basic_string_view<char> fmt;
  string_view fmt_00;
  format_args args;
  uint local_68 [2];
  undefined8 local_60;
  undefined4 local_58;
  char *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 *local_38;
  code *local_30;
  
  local_38 = (undefined1 *)local_68;
  uVar1 = tm_time->tm_mday;
  if (uVar1 < 100) {
    bVar2 = (byte)((uVar1 & 0xff) / 10);
    sVar3 = (dest->super_buffer<char>).size_;
    uVar4 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar4);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar4 = sVar3 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar3] = bVar2 | 0x30;
    sVar3 = (dest->super_buffer<char>).size_;
    uVar4 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar4);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar4 = sVar3 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar3] = (char)uVar1 + bVar2 * -10 | 0x30;
  }
  else {
    local_68[0] = 1;
    local_60 = 0;
    local_58 = 0;
    local_50 = "{:02}";
    local_48 = 5;
    local_40 = 0x100000000;
    local_30 = ::fmt::v11::detail::invoke_parse<int&,char>;
    fmt.size_ = (size_t)local_68;
    fmt.data_ = (char *)0x5;
    ::fmt::v11::detail::
    parse_format_string<char,fmt::v11::detail::format_string_checker<char,1,0,false>>
              ((detail *)"{:02}",fmt,(format_string_checker<char,_1,_0,_false> *)dest);
    fmt_00.size_ = 5;
    fmt_00.data_ = "{:02}";
    args.field_1.values_ = (value<fmt::v11::context> *)local_68;
    args.desc_ = 1;
    local_68[0] = uVar1;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt_00,args,(locale_ref)0x0);
  }
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad2(tm_time.tm_mday, dest);
    }